

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O2

int32_t __thiscall icu_63::UnifiedCache::removeHardRef(UnifiedCache *this,SharedObject *value)

{
  u_atomic_int32_t *puVar1;
  int iVar2;
  
  iVar2 = 0;
  if (value != (SharedObject *)0x0) {
    LOCK();
    puVar1 = &value->hardRefCount;
    iVar2 = (puVar1->super___atomic_base<int>)._M_i;
    (puVar1->super___atomic_base<int>)._M_i = (puVar1->super___atomic_base<int>)._M_i + -1;
    UNLOCK();
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) {
      this->fNumValuesInUse = this->fNumValuesInUse + -1;
      return 0;
    }
  }
  return iVar2;
}

Assistant:

int32_t UnifiedCache::removeHardRef(const SharedObject *value) const {
    int refCount = 0;
    if (value) {
        refCount = umtx_atomic_dec(&value->hardRefCount);
        U_ASSERT(refCount >= 0);
        if (refCount == 0) {
            --fNumValuesInUse;
        }
    }
    return refCount;
}